

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int cmcmd::ExecuteEchoColor
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  char *__s1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool newline;
  int iVar2;
  long lVar3;
  FILE *pFVar4;
  unsigned_long uVar5;
  char *c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  pointer pbVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  string dirName;
  string fName;
  string progressDir;
  uint local_c8;
  bool local_c1;
  int local_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_b8 = args;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
LAB_0025a7a5:
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    return 0;
  }
  uVar11 = 2;
  local_c1 = true;
  newline = true;
  local_c8 = 0;
LAB_0025a2b0:
  lVar3 = std::__cxx11::string::find((char *)(pbVar8 + uVar11),0x55fd1c,0);
  if (lVar3 != 0) {
    pbVar8 = (local_b8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __s1 = pbVar8[uVar11]._M_dataplus._M_p;
    pbVar8 = pbVar8 + uVar11;
    iVar2 = strncmp(__s1,"--progress-dir=",0xf);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)pbVar8);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      goto LAB_0025a4dc;
    }
    iVar2 = strncmp(__s1,"--progress-num=",0xf);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar8);
      pvVar1 = local_b8;
      if (iVar2 == 0) {
        local_c8 = 0;
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((local_b8->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar2 == 0) {
          local_c8 = 1;
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((pvVar1->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar2 == 0) {
            local_c8 = 2;
          }
          else {
            iVar2 = std::__cxx11::string::compare
                              ((char *)((pvVar1->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar11));
            if (iVar2 == 0) {
              local_c8 = 3;
            }
            else {
              iVar2 = std::__cxx11::string::compare
                                ((char *)((pvVar1->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar2 == 0) {
                local_c8 = 4;
              }
              else {
                iVar2 = std::__cxx11::string::compare
                                  ((char *)((pvVar1->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar11));
                if (iVar2 == 0) {
                  local_c8 = 5;
                }
                else {
                  iVar2 = std::__cxx11::string::compare
                                    ((char *)((pvVar1->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar11));
                  if (iVar2 == 0) {
                    local_c8 = 6;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare
                                      ((char *)((pvVar1->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar11)
                                      );
                    if (iVar2 == 0) {
                      local_c8 = 7;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare
                                        ((char *)((pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar11));
                      if (iVar2 == 0) {
                        local_c8 = 8;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare
                                          ((char *)((pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11));
                        if (iVar2 == 0) {
                          local_c8 = local_c8 | 0x100;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare
                                            ((char *)((pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11));
                          if (iVar2 == 0) {
                            newline = false;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare
                                              ((char *)((pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11));
                            if (iVar2 == 0) {
                              newline = true;
                            }
                            else {
                              cmSystemTools::MakefileColorEcho
                                        (local_c8,(pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar11]
                                                  ._M_dataplus._M_p,newline,local_c1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0025a783;
    }
    if (local_68 == 0) goto LAB_0025a783;
    std::__cxx11::string::substr((ulong)local_50,(ulong)pbVar8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_70,local_70 + local_68);
    std::__cxx11::string::append((char *)&local_b0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    pFVar4 = (FILE *)cmsys::SystemTools::Fopen(&local_90,"r");
    local_bc = 0;
    if (pFVar4 != (FILE *)0x0) {
      iVar2 = __isoc99_fscanf(pFVar4,"%i",&local_bc);
      if (iVar2 != 1) {
        cmSystemTools::Message("Could not read from progress file.",(char *)0x0);
      }
      fclose(pFVar4);
      paVar6 = local_50[0];
      paVar10 = local_50[0];
      do {
        if ((paVar6->_M_local_buf[0] == ',') || (paVar6->_M_local_buf[0] == '\0')) {
          if (paVar6 != paVar10) {
            std::__cxx11::string::_M_assign((string *)&local_90);
            std::__cxx11::string::append((char *)&local_90);
            std::__cxx11::string::append((char *)&local_90,(ulong)paVar10);
            pFVar4 = (FILE *)cmsys::SystemTools::Fopen(&local_90,"w");
            if (pFVar4 != (FILE *)0x0) {
              fwrite("empty",5,1,pFVar4);
              fclose(pFVar4);
            }
          }
          if (paVar6->_M_local_buf[0] == '\0') goto LAB_0025a697;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar6->_M_local_buf + 1);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar6->_M_local_buf + 1);
      } while( true );
    }
    goto LAB_0025a6d4;
  }
  std::__cxx11::string::substr
            ((ulong)&local_b0,
             (ulong)((local_b8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar11));
  if (local_b0._M_string_length != 0) {
    local_c1 = cmSystemTools::IsOn(local_b0._M_dataplus._M_p);
  }
LAB_0025a4dc:
  uVar7 = local_b0.field_2._M_allocated_capacity;
  _Var9._M_p = local_b0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_0025a4f4;
  goto LAB_0025a783;
LAB_0025a697:
  uVar5 = cmsys::Directory::GetNumberOfFilesInDirectory(&local_b0);
  if (0 < local_bc) {
    fprintf(_stdout,"[%3i%%] ",(long)((int)uVar5 * 100 + -300) / (long)local_bc & 0xffffffff);
  }
LAB_0025a6d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  uVar7 = local_40[0];
  _Var9._M_p = (pointer)local_50[0];
  if (local_50[0] !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
LAB_0025a4f4:
    operator_delete(_Var9._M_p,uVar7 + 1);
  }
LAB_0025a783:
  uVar11 = (ulong)((int)uVar11 + 1);
  pbVar8 = (local_b8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(local_b8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar11)
  goto LAB_0025a7a5;
  goto LAB_0025a2b0;
}

Assistant:

int cmcmd::ExecuteEchoColor(std::vector<std::string>& args)
{
  // The arguments are
  //   argv[0] == <cmake-executable>
  //   argv[1] == cmake_echo_color

  bool enabled = true;
  int color = cmsysTerminal_Color_Normal;
  bool newline = true;
  std::string progressDir;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i].find("--switch=") == 0) {
      // Enable or disable color based on the switch value.
      std::string value = args[i].substr(9);
      if (!value.empty()) {
        enabled = cmSystemTools::IsOn(value.c_str());
      }
    } else if (cmHasLiteralPrefix(args[i], "--progress-dir=")) {
      progressDir = args[i].substr(15);
    } else if (cmHasLiteralPrefix(args[i], "--progress-num=")) {
      if (!progressDir.empty()) {
        std::string const& progressNum = args[i].substr(15);
        cmcmdProgressReport(progressDir, progressNum);
      }
    } else if (args[i] == "--normal") {
      color = cmsysTerminal_Color_Normal;
    } else if (args[i] == "--black") {
      color = cmsysTerminal_Color_ForegroundBlack;
    } else if (args[i] == "--red") {
      color = cmsysTerminal_Color_ForegroundRed;
    } else if (args[i] == "--green") {
      color = cmsysTerminal_Color_ForegroundGreen;
    } else if (args[i] == "--yellow") {
      color = cmsysTerminal_Color_ForegroundYellow;
    } else if (args[i] == "--blue") {
      color = cmsysTerminal_Color_ForegroundBlue;
    } else if (args[i] == "--magenta") {
      color = cmsysTerminal_Color_ForegroundMagenta;
    } else if (args[i] == "--cyan") {
      color = cmsysTerminal_Color_ForegroundCyan;
    } else if (args[i] == "--white") {
      color = cmsysTerminal_Color_ForegroundWhite;
    } else if (args[i] == "--bold") {
      color |= cmsysTerminal_Color_ForegroundBold;
    } else if (args[i] == "--no-newline") {
      newline = false;
    } else if (args[i] == "--newline") {
      newline = true;
    } else {
      // Color is enabled.  Print with the current color.
      cmSystemTools::MakefileColorEcho(color, args[i].c_str(), newline,
                                       enabled);
    }
  }

  return 0;
}